

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistent_cohomology.h
# Opt level: O2

void __thiscall
Gudhi::persistent_cohomology::
Persistent_cohomology<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,_Gudhi::persistent_cohomology::Field_Zp>
::annotation_of_the_boundary
          (Persistent_cohomology<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,_Gudhi::persistent_cohomology::Field_Zp>
           *this,map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
                 *map_a_ds,Simplex_handle *sigma,int dim_sigma)

{
  long lVar1;
  uint uVar2;
  Element EVar3;
  node_ptr next;
  Simplex_handle *pSVar4;
  clock_t cVar5;
  iterator __position;
  long *plVar6;
  long *plVar7;
  long *plVar8;
  long *in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_int>_>,_bool> pVar9;
  int sign;
  Arith_element w_y;
  _Rb_tree<unsigned_int,std::pair<unsigned_int_const,int>,std::_Select1st<std::pair<unsigned_int_const,int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,int>>>
  *local_368;
  Column *curr_col;
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>
  local_358;
  Simplex_tree_boundary_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>
  __begin0;
  undefined1 local_288 [200];
  Simplex_tree_boundary_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>
  local_1c0;
  Simplex_tree_boundary_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>
  __end0;
  
  local_368 = (_Rb_tree<unsigned_int,std::pair<unsigned_int_const,int>,std::_Select1st<std::pair<unsigned_int_const,int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,int>>>
               *)map_a_ds;
  if ((char)in_FS_OFFSET[-1] == '\0') {
    in_FS_OFFSET[-2] = 0;
    in_FS_OFFSET[-4] = 0;
    in_FS_OFFSET[-3] = 0;
    __cxa_thread_atexit(std::
                        vector<std::pair<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>_*,_int>,_std::allocator<std::pair<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>_*,_int>_>_>
                        ::~vector,*in_FS_OFFSET + -0x20,&__dso_handle);
    *(undefined1 *)(in_FS_OFFSET + -1) = 1;
  }
  lVar1 = *in_FS_OFFSET;
  if (in_FS_OFFSET[-3] != in_FS_OFFSET[-4]) {
    in_FS_OFFSET[-3] = in_FS_OFFSET[-4];
  }
  sign = (dim_sigma % 2) * -2 + 1;
  local_358.m_ptr = sigma->m_ptr;
  Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::
  boundary_simplex_range<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>>
            ((Boundary_simplex_range *)local_288,this->cpx_,&local_358);
  Simplex_tree_boundary_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>
  ::Simplex_tree_boundary_simplex_iterator
            (&__begin0,
             (Simplex_tree_boundary_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>
              *)local_288);
  Simplex_tree_boundary_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>
  ::Simplex_tree_boundary_simplex_iterator(&__end0,&local_1c0);
  while (__begin0.sh_.m_ptr != __end0.sh_.m_ptr) {
    pSVar4 = Simplex_tree_boundary_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>
             ::dereference(&__begin0);
    uVar2 = (pSVar4->m_ptr->second).super_Key_simplex_base.key_;
    if (uVar2 != 0xffffffff) {
      uVar2 = boost::disjoint_sets<int_*,_unsigned_int_*,_boost::find_with_full_path_compression>::
              find_set<unsigned_int>(&this->dsets_,uVar2);
      curr_col = (this->ds_repr_).
                 super__Vector_base<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>_*,_std::allocator<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar2];
      if (curr_col != (Persistent_cohomology_column<unsigned_int,_int> *)0x0) {
        std::
        vector<std::pair<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,int>*,int>,std::allocator<std::pair<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,int>*,int>>>
        ::
        emplace_back<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,int>*&,int&>
                  ((vector<std::pair<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,int>*,int>,std::allocator<std::pair<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,int>*,int>>>
                    *)(lVar1 + -0x20),&curr_col,&sign);
      }
    }
    sign = -sign;
    Simplex_tree_boundary_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>
    ::increment(&__begin0);
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<std::pair<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,int>*,int>*,std::vector<std::pair<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,int>*,int>,std::allocator<std::pair<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,int>*,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<Gudhi::persistent_cohomology::Persistent_cohomology<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,Gudhi::persistent_cohomology::Field_Zp>::annotation_of_the_boundary(std::map<unsigned_int,int,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,int>>>&,boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,int)::_lambda(std::pair<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,int>*,int>const&,std::pair<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,int>*,int>const&)_1_>>
            (in_FS_OFFSET[-4],in_FS_OFFSET[-3]);
  plVar7 = (long *)in_FS_OFFSET[-4];
  while (plVar7 != (long *)in_FS_OFFSET[-3]) {
    lVar1 = *plVar7;
    __end0.last_ = (Vertex_handle)plVar7[1];
    plVar6 = plVar7;
    while ((plVar7 = plVar6 + 2, plVar7 != (long *)in_FS_OFFSET[-3] && (*plVar7 == lVar1))) {
      __end0.last_ = __end0.last_ + (int)plVar6[3];
      plVar6 = plVar7;
    }
    if (__end0.last_ != 0) {
      plVar8 = (long *)(lVar1 + 0x20);
      plVar6 = plVar8;
      while (plVar6 = (long *)*plVar6, plVar6 != plVar8) {
        local_288._0_8_ = 0;
        local_288._8_8_ = (long *)0x0;
        local_288._32_8_ = plVar6[2];
        local_288._40_8_ = plVar6[3];
        cVar5 = Field_Zp::times(&this->coeff_field_,
                                (tms *)((long)&((Simplex_tree_boundary_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>
                                                 *)local_288)->suffix_ + 0x1c));
        w_y = (Arith_element)cVar5;
        if (w_y != 0) {
          __begin0.last_ = local_288._32_4_;
          __begin0.next_ = w_y;
          pVar9 = std::
                  _Rb_tree<unsigned_int,std::pair<unsigned_int_const,int>,std::_Select1st<std::pair<unsigned_int_const,int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,int>>>
                  ::_M_emplace_unique<std::pair<unsigned_int,int>>
                            (local_368,(pair<unsigned_int,_int> *)&__begin0);
          __position._M_node = (_Base_ptr)pVar9.first._M_node;
          if (((undefined1  [16])pVar9 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            EVar3 = Field_Zp::plus_equal
                              (&this->coeff_field_,(Element *)&__position._M_node[1].field_0x4,&w_y)
            ;
            *(Element *)&__position._M_node[1].field_0x4 = EVar3;
            if (EVar3 == 0) {
              std::
              _Rb_tree<unsigned_int,std::pair<unsigned_int_const,int>,std::_Select1st<std::pair<unsigned_int_const,int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,int>>>
              ::erase_abi_cxx11_(local_368,__position);
            }
          }
        }
        if (local_288._0_8_ != 0) {
          *(undefined8 *)local_288._8_8_ = local_288._0_8_;
          *(undefined8 *)(local_288._0_8_ + 8) = local_288._8_8_;
        }
      }
    }
  }
  return;
}

Assistant:

void annotation_of_the_boundary(
      std::map<Simplex_key, Arith_element> & map_a_ds, Simplex_handle sigma,
      int dim_sigma) {
    // traverses the boundary of sigma, keeps track of the annotation vectors,
    // with multiplicity. We used to sum the coefficients directly in
    // annotations_in_boundary by using a map, we now do it later.
    typedef std::pair<Column *, int> annotation_t;
    thread_local std::vector<annotation_t> annotations_in_boundary;
    annotations_in_boundary.clear();
    int sign = 1 - 2 * (dim_sigma % 2);  // \in {-1,1} provides the sign in the
                                         // alternate sum in the boundary.
    Simplex_key key;
    Column * curr_col;

    for (auto sh : cpx_->boundary_simplex_range(sigma)) {
      key = cpx_->key(sh);
      if (key != cpx_->null_key()) {  // A simplex with null_key is a killer, and have null annotation
        // Find its annotation vector
        curr_col = ds_repr_[dsets_.find_set(key)];
        if (curr_col != NULL) {  // and insert it in annotations_in_boundary with multyiplicative factor "sign".
          annotations_in_boundary.emplace_back(curr_col, sign);
        }
      }
      sign = -sign;
    }
    // Place identical annotations consecutively so we can easily sum their multiplicities.
    std::sort(annotations_in_boundary.begin(), annotations_in_boundary.end(),
              [](annotation_t const& a, annotation_t const& b) { return a.first < b.first; });

    // Sum the annotations with multiplicity, using a map<key,coeff>
    // to represent a sparse vector.
    std::pair<typename std::map<Simplex_key, Arith_element>::iterator, bool> result_insert_a_ds;

    for (auto ann_it = annotations_in_boundary.begin(); ann_it != annotations_in_boundary.end(); /**/) {
      Column* col = ann_it->first;
      int mult = ann_it->second;
      while (++ann_it != annotations_in_boundary.end() && ann_it->first == col) {
        mult += ann_it->second;
      }
      // The following test is just a heuristic, it is not required, and it is fine that is misses p == 0.
      if (mult != coeff_field_.additive_identity()) {  // For all columns in the boundary,
        for (auto cell_ref : col->col_) {  // insert every cell in map_a_ds with multiplicity
          Arith_element w_y = coeff_field_.times(cell_ref.coefficient_, mult);  // coefficient * multiplicity

          if (w_y != coeff_field_.additive_identity()) {  // if != 0
            result_insert_a_ds = map_a_ds.insert(std::pair<Simplex_key, Arith_element>(cell_ref.key_, w_y));
            if (!(result_insert_a_ds.second)) {  // if cell_ref.key_ already a Key in map_a_ds
              result_insert_a_ds.first->second = coeff_field_.plus_equal(result_insert_a_ds.first->second, w_y);
              if (result_insert_a_ds.first->second == coeff_field_.additive_identity()) {
                map_a_ds.erase(result_insert_a_ds.first);
              }
            }
          }
        }
      }
    }
  }